

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O0

bool __thiscall QPDFTokenizer::Token::operator==(Token *this,Token *rhs)

{
  __type_conflict1 local_19;
  Token *rhs_local;
  Token *this_local;
  
  local_19 = false;
  if ((*(int *)this != 0) && (local_19 = false, *(int *)this == *(int *)rhs)) {
    local_19 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (this + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (rhs + 8));
  }
  return local_19;
}

Assistant:

bool
        operator==(Token const& rhs) const
        {
            // Ignore fields other than type and value
            return (
                (this->type != tt_bad) && (this->type == rhs.type) && (this->value == rhs.value));
        }